

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::SubGridIntersector1Moeller<8,_true>_>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  RTCRayQueryContext *pRVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  byte bVar35;
  byte bVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  Geometry *geometry;
  RTCIntersectArguments *pRVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  ulong unaff_R12;
  ulong uVar49;
  long lVar50;
  ulong *puVar51;
  ulong uVar52;
  uint uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  float fVar74;
  float fVar75;
  undefined4 uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  float fVar86;
  float fVar87;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar88;
  undefined1 auVar85 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  uint uVar103;
  uint uVar104;
  uint uVar105;
  float fVar106;
  float fVar107;
  uint uVar108;
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  MoellerTrumboreHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_276c;
  RTCIntersectArguments *local_2768;
  ulong local_2760;
  RTCRayQueryContext *local_2758;
  ulong local_2750;
  ulong local_2748;
  ulong local_2740;
  ulong local_2738;
  ulong local_2730;
  ulong local_2728;
  ulong local_2720;
  ulong *local_2718;
  ulong local_2710;
  ulong local_2708;
  ulong local_2700;
  ulong local_26f8;
  ulong local_26f0;
  ulong local_26e8;
  ulong local_26e0;
  long local_26d8;
  long local_26d0;
  long local_26c8;
  RTCFilterFunctionNArguments local_26c0;
  float local_2690;
  undefined4 local_268c;
  undefined4 local_2688;
  float local_2684;
  float local_2680;
  uint local_267c;
  uint local_2678;
  uint local_2674;
  uint local_2670;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  float local_2540;
  float fStack_253c;
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  byte local_24df;
  float local_24c0 [4];
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_24a0 [4];
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2398[0] = 0;
    if (local_23a0 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar15 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar84 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar54._8_4_ = 0x7fffffff;
      auVar54._0_8_ = 0x7fffffff7fffffff;
      auVar54._12_4_ = 0x7fffffff;
      auVar54 = vandps_avx512vl((undefined1  [16])aVar2,auVar54);
      local_2718 = local_2390;
      auVar92._8_4_ = 0x219392ef;
      auVar92._0_8_ = 0x219392ef219392ef;
      auVar92._12_4_ = 0x219392ef;
      uVar49 = vcmpps_avx512vl(auVar54,auVar92,1);
      bVar14 = (bool)((byte)uVar49 & 1);
      auVar55._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * (int)aVar2.x;
      bVar14 = (bool)((byte)(uVar49 >> 1) & 1);
      auVar55._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * (int)aVar2.y;
      bVar14 = (bool)((byte)(uVar49 >> 2) & 1);
      auVar55._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * (int)aVar2.z;
      bVar14 = (bool)((byte)(uVar49 >> 3) & 1);
      auVar55._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * aVar2.field_3.a;
      auVar54 = vrcp14ps_avx512vl(auVar55);
      auVar56._8_4_ = 0x3f800000;
      auVar56._0_8_ = &DAT_3f8000003f800000;
      auVar56._12_4_ = 0x3f800000;
      auVar56 = vfnmadd213ps_avx512vl(auVar55,auVar54,auVar56);
      auVar55 = vfmadd132ps_fma(auVar56,auVar54,auVar54);
      fVar74 = auVar55._0_4_;
      auVar57 = vbroadcastss_avx512vl(auVar55);
      auVar110 = ZEXT3264(auVar57);
      auVar54 = vmovshdup_avx(auVar55);
      auVar57 = vbroadcastsd_avx512vl(auVar54);
      auVar111 = ZEXT3264(auVar57);
      auVar56 = vshufpd_avx(auVar55,auVar55,1);
      auVar71._8_4_ = 2;
      auVar71._0_8_ = 0x200000002;
      auVar71._12_4_ = 2;
      auVar71._16_4_ = 2;
      auVar71._20_4_ = 2;
      auVar71._24_4_ = 2;
      auVar71._28_4_ = 2;
      auVar96 = ZEXT3264(auVar71);
      auVar57 = vpermps_avx512vl(auVar71,ZEXT1632(auVar55));
      auVar112 = ZEXT3264(auVar57);
      fVar75 = fVar74 * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar70._4_4_ = fVar75;
      auVar70._0_4_ = fVar75;
      auVar70._8_4_ = fVar75;
      auVar70._12_4_ = fVar75;
      auVar70._16_4_ = fVar75;
      auVar70._20_4_ = fVar75;
      auVar70._24_4_ = fVar75;
      auVar70._28_4_ = fVar75;
      auVar57 = vbroadcastss_avx512vl(ZEXT416(1));
      auVar113 = ZEXT3264(auVar57);
      auVar59 = ZEXT1632(CONCAT412(auVar55._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar55._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar55._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar75))));
      auVar58 = vpermps_avx512vl(auVar57,auVar59);
      auVar57 = vpermps_avx2(auVar71,auVar59);
      local_2728 = (ulong)(fVar74 < 0.0) << 5;
      local_2730 = (ulong)(auVar54._0_4_ < 0.0) << 5 | 0x40;
      local_2738 = (ulong)(auVar56._0_4_ < 0.0) << 5 | 0x80;
      local_2740 = local_2728 ^ 0x20;
      local_2748 = local_2730 ^ 0x20;
      local_2750 = local_2738 ^ 0x20;
      auVar59 = vbroadcastss_avx512vl(auVar15);
      auVar114 = ZEXT3264(auVar59);
      auVar59 = vbroadcastss_avx512vl(auVar84);
      auVar115 = ZEXT3264(auVar59);
      auVar60._8_4_ = 0x80000000;
      auVar60._0_8_ = 0x8000000080000000;
      auVar60._12_4_ = 0x80000000;
      auVar60._16_4_ = 0x80000000;
      auVar60._20_4_ = 0x80000000;
      auVar60._24_4_ = 0x80000000;
      auVar60._28_4_ = 0x80000000;
      auVar59 = vxorps_avx512vl(auVar70,auVar60);
      auVar116 = ZEXT3264(auVar59);
      auVar58 = vxorps_avx512vl(auVar58,auVar60);
      auVar117 = ZEXT3264(auVar58);
      auVar57 = vxorps_avx512vl(auVar57,auVar60);
      auVar118 = ZEXT3264(auVar57);
      local_26e8 = (ulong)(((uint)(fVar74 < 0.0) << 5) >> 2);
      local_26f0 = local_2740 >> 2;
      local_26f8 = local_2730 >> 2;
      local_2700 = local_2748 >> 2;
      local_2708 = local_2738 >> 2;
      auVar57 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar119 = ZEXT3264(auVar57);
      auVar97 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      local_2710 = local_2750 >> 2;
      uVar49 = local_2750;
      uVar40 = local_2728;
      uVar44 = local_2730;
      uVar45 = local_2738;
      uVar46 = local_2740;
      uVar47 = local_2748;
      do {
        do {
          puVar51 = &local_23a0;
          do {
            if (local_2718 == puVar51) {
              return;
            }
            pfVar1 = (float *)(local_2718 + -1);
            local_2718 = local_2718 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar1);
          uVar52 = *local_2718;
          do {
            if ((uVar52 & 8) == 0) {
              auVar57 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar52 + 0x40 + uVar40),auVar116._0_32_,
                                   auVar110._0_32_);
              auVar58 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar52 + 0x40 + uVar44),auVar117._0_32_,
                                   auVar111._0_32_);
              auVar57 = vpmaxsd_avx2(auVar57,auVar58);
              auVar59 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar52 + 0x40 + uVar45),auVar118._0_32_,
                                   auVar112._0_32_);
              auVar58 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar52 + 0x40 + uVar46),auVar116._0_32_,
                                   auVar110._0_32_);
              auVar60 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar52 + 0x40 + uVar47),auVar117._0_32_,
                                   auVar111._0_32_);
              auVar58 = vpminsd_avx2(auVar58,auVar60);
              auVar60 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar52 + 0x40 + uVar49),auVar118._0_32_,
                                   auVar112._0_32_);
              auVar59 = vpmaxsd_avx512vl(auVar59,auVar114._0_32_);
              auVar57 = vpmaxsd_avx2(auVar57,auVar59);
              auVar96 = ZEXT3264(auVar57);
              auVar59 = vpminsd_avx512vl(auVar60,auVar115._0_32_);
              auVar58 = vpminsd_avx2(auVar58,auVar59);
              uVar22 = vpcmpd_avx512vl(auVar57,auVar58,2);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)(byte)uVar22);
            }
            if ((uVar52 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar38 = 4;
              }
              else {
                auVar57 = *(undefined1 (*) [32])(uVar52 & 0xfffffffffffffff0);
                auVar58 = ((undefined1 (*) [32])(uVar52 & 0xfffffffffffffff0))[1];
                auVar59 = vmovdqa64_avx512vl(auVar119._0_32_);
                auVar71 = auVar96._0_32_;
                auVar59 = vpternlogd_avx512vl(auVar59,auVar71,auVar97._0_32_,0xf8);
                uVar52 = unaff_R12 & 0xffffffff;
                auVar60 = vpcompressd_avx512vl(auVar59);
                bVar14 = (bool)((byte)uVar52 & 1);
                auVar65._0_4_ = (uint)bVar14 * auVar60._0_4_ | (uint)!bVar14 * auVar59._0_4_;
                bVar14 = (bool)((byte)(uVar52 >> 1) & 1);
                auVar65._4_4_ = (uint)bVar14 * auVar60._4_4_ | (uint)!bVar14 * auVar59._4_4_;
                bVar14 = (bool)((byte)(uVar52 >> 2) & 1);
                auVar65._8_4_ = (uint)bVar14 * auVar60._8_4_ | (uint)!bVar14 * auVar59._8_4_;
                bVar14 = (bool)((byte)(uVar52 >> 3) & 1);
                auVar65._12_4_ = (uint)bVar14 * auVar60._12_4_ | (uint)!bVar14 * auVar59._12_4_;
                bVar14 = (bool)((byte)(uVar52 >> 4) & 1);
                auVar65._16_4_ = (uint)bVar14 * auVar60._16_4_ | (uint)!bVar14 * auVar59._16_4_;
                bVar14 = (bool)((byte)(uVar52 >> 5) & 1);
                auVar65._20_4_ = (uint)bVar14 * auVar60._20_4_ | (uint)!bVar14 * auVar59._20_4_;
                bVar14 = (bool)((byte)(uVar52 >> 6) & 1);
                auVar65._24_4_ = (uint)bVar14 * auVar60._24_4_ | (uint)!bVar14 * auVar59._24_4_;
                bVar14 = (bool)((byte)(uVar52 >> 7) & 1);
                auVar65._28_4_ = (uint)bVar14 * auVar60._28_4_ | (uint)!bVar14 * auVar59._28_4_;
                auVar59 = vpermt2q_avx512vl(auVar57,auVar65,auVar58);
                uVar52 = auVar59._0_8_;
                iVar37 = 0;
                uVar41 = unaff_R12 - 1 & unaff_R12;
                iVar38 = 0;
                if (uVar41 != 0) {
                  auVar59 = vpshufd_avx2(auVar65,0x55);
                  vpermt2q_avx512vl(auVar57,auVar59,auVar58);
                  auVar60 = vpminsd_avx2(auVar65,auVar59);
                  auVar59 = vpmaxsd_avx2(auVar65,auVar59);
                  uVar41 = uVar41 - 1 & uVar41;
                  iVar38 = iVar37;
                  if (uVar41 == 0) {
                    auVar60 = vpermi2q_avx512vl(auVar60,auVar57,auVar58);
                    uVar52 = auVar60._0_8_;
                    auVar57 = vpermt2q_avx512vl(auVar57,auVar59,auVar58);
                    *local_2718 = auVar57._0_8_;
                    auVar57 = vpermd_avx2(auVar59,auVar71);
                    *(int *)(local_2718 + 1) = auVar57._0_4_;
                    local_2718 = local_2718 + 2;
                  }
                  else {
                    auVar64 = vpshufd_avx2(auVar65,0xaa);
                    vpermt2q_avx512vl(auVar57,auVar64,auVar58);
                    auVar70 = vpminsd_avx2(auVar60,auVar64);
                    auVar60 = vpmaxsd_avx2(auVar60,auVar64);
                    auVar64 = vpminsd_avx2(auVar59,auVar60);
                    auVar59 = vpmaxsd_avx2(auVar59,auVar60);
                    uVar41 = uVar41 - 1 & uVar41;
                    if (uVar41 == 0) {
                      auVar60 = vpermi2q_avx512vl(auVar70,auVar57,auVar58);
                      uVar52 = auVar60._0_8_;
                      auVar60 = vpermt2q_avx512vl(auVar57,auVar59,auVar58);
                      *local_2718 = auVar60._0_8_;
                      auVar59 = vpermd_avx2(auVar59,auVar71);
                      auVar96 = ZEXT3264(auVar71);
                      *(int *)(local_2718 + 1) = auVar59._0_4_;
                      auVar57 = vpermt2q_avx512vl(auVar57,auVar64,auVar58);
                      local_2718[2] = auVar57._0_8_;
                      auVar57 = vpermd_avx2(auVar64,auVar71);
                      *(int *)(local_2718 + 3) = auVar57._0_4_;
                      local_2718 = local_2718 + 4;
                    }
                    else {
                      auVar60 = vpshufd_avx2(auVar65,0xff);
                      vpermt2q_avx512vl(auVar57,auVar60,auVar58);
                      auVar66 = vpminsd_avx2(auVar70,auVar60);
                      auVar60 = vpmaxsd_avx2(auVar70,auVar60);
                      auVar70 = vpminsd_avx2(auVar64,auVar60);
                      auVar60 = vpmaxsd_avx2(auVar64,auVar60);
                      auVar64 = vpminsd_avx2(auVar59,auVar60);
                      auVar59 = vpmaxsd_avx2(auVar59,auVar60);
                      uVar41 = uVar41 - 1 & uVar41;
                      if (uVar41 == 0) {
                        auVar60 = vpermi2q_avx512vl(auVar66,auVar57,auVar58);
                        uVar52 = auVar60._0_8_;
                        auVar60 = vpermt2q_avx512vl(auVar57,auVar59,auVar58);
                        *local_2718 = auVar60._0_8_;
                        auVar59 = vpermd_avx2(auVar59,auVar71);
                        *(int *)(local_2718 + 1) = auVar59._0_4_;
                        auVar59 = vpermt2q_avx512vl(auVar57,auVar64,auVar58);
                        local_2718[2] = auVar59._0_8_;
                        auVar59 = vpermd_avx2(auVar64,auVar71);
                        *(int *)(local_2718 + 3) = auVar59._0_4_;
                        auVar57 = vpermt2q_avx512vl(auVar57,auVar70,auVar58);
                        local_2718[4] = auVar57._0_8_;
                        auVar57 = vpermd_avx2(auVar70,auVar71);
                        *(int *)(local_2718 + 5) = auVar57._0_4_;
                        local_2718 = local_2718 + 6;
                      }
                      else {
                        auVar61 = valignd_avx512vl(auVar65,auVar65,3);
                        auVar60 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                        auVar65 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                       CONCAT48(0x80000000,
                                                                                0x8000000080000000))
                                                            ),auVar60,auVar66);
                        auVar60 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                        auVar70 = vpermt2d_avx512vl(auVar65,auVar60,auVar70);
                        auVar70 = vpermt2d_avx512vl(auVar70,auVar60,auVar64);
                        auVar60 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar59 = vpermt2d_avx512vl(auVar70,auVar60,auVar59);
                        auVar96 = ZEXT3264(auVar59);
                        uVar52 = uVar41;
                        do {
                          auVar60 = auVar96._0_32_;
                          auVar59 = vpermps_avx512vl(auVar113._0_32_,auVar61);
                          auVar61 = valignd_avx512vl(auVar61,auVar61,1);
                          vpermt2q_avx512vl(auVar57,auVar61,auVar58);
                          uVar52 = uVar52 - 1 & uVar52;
                          uVar22 = vpcmpd_avx512vl(auVar59,auVar60,5);
                          auVar59 = vpmaxsd_avx2(auVar59,auVar60);
                          bVar35 = (byte)uVar22 << 1;
                          auVar60 = valignd_avx512vl(auVar60,auVar60,7);
                          bVar14 = (bool)((byte)uVar22 & 1);
                          auVar64._4_4_ =
                               (uint)bVar14 * auVar60._4_4_ | (uint)!bVar14 * auVar59._4_4_;
                          auVar64._0_4_ = auVar59._0_4_;
                          bVar14 = (bool)(bVar35 >> 2 & 1);
                          auVar64._8_4_ =
                               (uint)bVar14 * auVar60._8_4_ | (uint)!bVar14 * auVar59._8_4_;
                          bVar14 = (bool)(bVar35 >> 3 & 1);
                          auVar64._12_4_ =
                               (uint)bVar14 * auVar60._12_4_ | (uint)!bVar14 * auVar59._12_4_;
                          bVar14 = (bool)(bVar35 >> 4 & 1);
                          auVar64._16_4_ =
                               (uint)bVar14 * auVar60._16_4_ | (uint)!bVar14 * auVar59._16_4_;
                          bVar14 = (bool)(bVar35 >> 5 & 1);
                          auVar64._20_4_ =
                               (uint)bVar14 * auVar60._20_4_ | (uint)!bVar14 * auVar59._20_4_;
                          bVar14 = (bool)(bVar35 >> 6 & 1);
                          auVar64._24_4_ =
                               (uint)bVar14 * auVar60._24_4_ | (uint)!bVar14 * auVar59._24_4_;
                          auVar64._28_4_ =
                               (uint)(bVar35 >> 7) * auVar60._28_4_ |
                               (uint)!(bool)(bVar35 >> 7) * auVar59._28_4_;
                          auVar96 = ZEXT3264(auVar64);
                        } while (uVar52 != 0);
                        lVar39 = POPCOUNT(uVar41) + 3;
                        do {
                          auVar59 = vpermi2q_avx512vl(auVar64,auVar57,auVar58);
                          *local_2718 = auVar59._0_8_;
                          auVar60 = auVar96._0_32_;
                          auVar59 = vpermd_avx2(auVar60,auVar71);
                          *(int *)(local_2718 + 1) = auVar59._0_4_;
                          auVar64 = valignd_avx512vl(auVar60,auVar60,1);
                          local_2718 = local_2718 + 2;
                          auVar96 = ZEXT3264(auVar64);
                          lVar39 = lVar39 + -1;
                        } while (lVar39 != 0);
                        auVar57 = vpermt2q_avx512vl(auVar57,auVar64,auVar58);
                        uVar52 = auVar57._0_8_;
                      }
                      auVar97 = ZEXT3264(auVar97._0_32_);
                      auVar96 = ZEXT3264(auVar71);
                    }
                  }
                }
              }
            }
            else {
              iVar38 = 6;
            }
          } while (iVar38 == 0);
        } while (iVar38 != 6);
        local_2720 = unaff_R12;
        local_23e0 = auVar96._0_32_;
        local_26d8 = (ulong)((uint)uVar52 & 0xf) - 8;
        if (local_26d8 != 0) {
          local_26d0 = 0;
          local_26e0 = uVar52 & 0xfffffffffffffff0;
          do {
            lVar39 = local_26d0 * 0x90;
            local_26c8 = local_26e0 + lVar39;
            auVar77._8_8_ = 0;
            auVar77._0_8_ = *(ulong *)(local_26e0 + 0x40 + lVar39);
            auVar81._8_8_ = 0;
            auVar81._0_8_ = *(ulong *)(local_26e0 + 0x48 + lVar39);
            uVar22 = vpcmpub_avx512vl(auVar77,auVar81,2);
            uVar76 = *(undefined4 *)(local_26e0 + 0x70 + lVar39);
            auVar58._4_4_ = uVar76;
            auVar58._0_4_ = uVar76;
            auVar58._8_4_ = uVar76;
            auVar58._12_4_ = uVar76;
            auVar58._16_4_ = uVar76;
            auVar58._20_4_ = uVar76;
            auVar58._24_4_ = uVar76;
            auVar58._28_4_ = uVar76;
            uVar76 = *(undefined4 *)(local_26e0 + 0x7c + lVar39);
            auVar61._4_4_ = uVar76;
            auVar61._0_4_ = uVar76;
            auVar61._8_4_ = uVar76;
            auVar61._12_4_ = uVar76;
            auVar61._16_4_ = uVar76;
            auVar61._20_4_ = uVar76;
            auVar61._24_4_ = uVar76;
            auVar61._28_4_ = uVar76;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = *(ulong *)(local_26e8 + 0x40 + local_26c8);
            auVar57 = vpmovzxbd_avx2(auVar15);
            auVar57 = vcvtdq2ps_avx(auVar57);
            auVar15 = vfmadd213ps_fma(auVar57,auVar61,auVar58);
            auVar84._8_8_ = 0;
            auVar84._0_8_ = *(ulong *)(local_26f0 + 0x40 + local_26c8);
            auVar57 = vpmovzxbd_avx2(auVar84);
            auVar57 = vcvtdq2ps_avx(auVar57);
            auVar84 = vfmadd213ps_fma(auVar57,auVar61,auVar58);
            uVar76 = *(undefined4 *)(local_26e0 + 0x74 + lVar39);
            auVar59._4_4_ = uVar76;
            auVar59._0_4_ = uVar76;
            auVar59._8_4_ = uVar76;
            auVar59._12_4_ = uVar76;
            auVar59._16_4_ = uVar76;
            auVar59._20_4_ = uVar76;
            auVar59._24_4_ = uVar76;
            auVar59._28_4_ = uVar76;
            uVar76 = *(undefined4 *)(local_26e0 + 0x80 + lVar39);
            auVar62._4_4_ = uVar76;
            auVar62._0_4_ = uVar76;
            auVar62._8_4_ = uVar76;
            auVar62._12_4_ = uVar76;
            auVar62._16_4_ = uVar76;
            auVar62._20_4_ = uVar76;
            auVar62._24_4_ = uVar76;
            auVar62._28_4_ = uVar76;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)(local_26f8 + 0x40 + local_26c8);
            auVar57 = vpmovzxbd_avx2(auVar3);
            auVar57 = vcvtdq2ps_avx(auVar57);
            auVar54 = vfmadd213ps_fma(auVar57,auVar62,auVar59);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)(local_2700 + 0x40 + local_26c8);
            auVar57 = vpmovzxbd_avx2(auVar4);
            auVar57 = vcvtdq2ps_avx(auVar57);
            auVar56 = vfmadd213ps_fma(auVar57,auVar62,auVar59);
            uVar76 = *(undefined4 *)(local_26e0 + 0x78 + lVar39);
            auVar66._4_4_ = uVar76;
            auVar66._0_4_ = uVar76;
            auVar66._8_4_ = uVar76;
            auVar66._12_4_ = uVar76;
            auVar66._16_4_ = uVar76;
            auVar66._20_4_ = uVar76;
            auVar66._24_4_ = uVar76;
            auVar66._28_4_ = uVar76;
            uVar76 = *(undefined4 *)(local_26e0 + 0x84 + lVar39);
            auVar63._4_4_ = uVar76;
            auVar63._0_4_ = uVar76;
            auVar63._8_4_ = uVar76;
            auVar63._12_4_ = uVar76;
            auVar63._16_4_ = uVar76;
            auVar63._20_4_ = uVar76;
            auVar63._24_4_ = uVar76;
            auVar63._28_4_ = uVar76;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(local_2708 + 0x40 + local_26c8);
            auVar57 = vpmovzxbd_avx2(auVar5);
            auVar57 = vcvtdq2ps_avx(auVar57);
            auVar55 = vfmadd213ps_fma(auVar57,auVar63,auVar66);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)(local_2710 + 0x40 + local_26c8);
            auVar57 = vpmovzxbd_avx2(auVar6);
            auVar57 = vcvtdq2ps_avx(auVar57);
            auVar92 = vfmadd213ps_fma(auVar57,auVar63,auVar66);
            auVar57 = vfmadd213ps_avx512vl(ZEXT1632(auVar15),auVar110._0_32_,auVar116._0_32_);
            auVar58 = vfmadd213ps_avx512vl(ZEXT1632(auVar54),auVar111._0_32_,auVar117._0_32_);
            auVar57 = vpmaxsd_avx2(auVar57,auVar58);
            auVar59 = vfmadd213ps_avx512vl(ZEXT1632(auVar55),auVar112._0_32_,auVar118._0_32_);
            auVar58 = vfmadd213ps_avx512vl(ZEXT1632(auVar84),auVar110._0_32_,auVar116._0_32_);
            auVar60 = vfmadd213ps_avx512vl(ZEXT1632(auVar56),auVar111._0_32_,auVar117._0_32_);
            auVar58 = vpminsd_avx2(auVar58,auVar60);
            auVar60 = vfmadd213ps_avx512vl(ZEXT1632(auVar92),auVar112._0_32_,auVar118._0_32_);
            auVar59 = vpmaxsd_avx512vl(auVar59,auVar114._0_32_);
            local_23c0 = vpmaxsd_avx2(auVar57,auVar59);
            auVar57 = vpminsd_avx512vl(auVar60,auVar115._0_32_);
            auVar57 = vpminsd_avx2(auVar58,auVar57);
            uVar23 = vpcmpd_avx512vl(local_23c0,auVar57,2);
            if ((byte)((byte)uVar23 & (byte)uVar22) != 0) {
              uVar49 = (ulong)(byte)((byte)uVar23 & (byte)uVar22);
              do {
                lVar39 = 0;
                for (uVar40 = uVar49; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000)
                {
                  lVar39 = lVar39 + 1;
                }
                fVar74 = (ray->super_RayK<1>).tfar;
                if (*(float *)(local_23c0 + lVar39 * 4) <= fVar74) {
                  uVar7 = *(uint *)(local_26c8 + 0x88);
                  uVar8 = *(uint *)(local_26c8 + 4 + lVar39 * 8);
                  pGVar9 = (context->scene->geometries).items[uVar7].ptr;
                  lVar10 = *(long *)&pGVar9->field_0x58;
                  lVar11 = *(long *)&pGVar9[1].time_range.upper;
                  lVar42 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar8;
                  uVar40 = *(ulong *)(local_26c8 + lVar39 * 8);
                  auVar82._8_2_ = 0x7fff;
                  auVar82._0_8_ = 0x7fff7fff7fff7fff;
                  auVar82._10_2_ = 0x7fff;
                  auVar82._12_2_ = 0x7fff;
                  auVar82._14_2_ = 0x7fff;
                  auVar78._8_8_ = 0;
                  auVar78._0_8_ = uVar40;
                  auVar15 = vpand_avx(auVar78,auVar82);
                  auVar92 = vpmovzxwd_avx(auVar15);
                  auVar83._8_8_ = 0;
                  auVar83._0_8_ = *(ulong *)(lVar10 + lVar42);
                  auVar15 = vpaddd_avx(auVar83,auVar92);
                  auVar84 = vpmulld_avx(auVar83,auVar92);
                  auVar84 = vpsrlq_avx(auVar84,0x20);
                  auVar15 = vpaddd_avx(auVar15,auVar84);
                  lVar50 = CONCAT44((int)((ulong)puVar51 >> 0x20),auVar15._0_4_);
                  p_Var12 = pGVar9[1].intersectionFilterN;
                  auVar15 = *(undefined1 (*) [16])(lVar11 + (lVar50 + 1) * (long)p_Var12);
                  uVar45 = *(ulong *)(lVar10 + lVar42) >> 0x20;
                  lVar39 = lVar50 + uVar45 + 1;
                  auVar84 = *(undefined1 (*) [16])(lVar11 + (lVar50 + uVar45) * (long)p_Var12);
                  auVar54 = *(undefined1 (*) [16])(lVar11 + lVar39 * (long)p_Var12);
                  uVar44 = (ulong)(-1 < (short)uVar40);
                  auVar56 = *(undefined1 (*) [16])(lVar11 + (lVar50 + uVar44 + 1) * (long)p_Var12);
                  lVar48 = uVar44 + lVar39;
                  puVar51 = (ulong *)(lVar48 * (long)p_Var12);
                  auVar55 = *(undefined1 (*) [16])(lVar11 + (long)puVar51);
                  uVar44 = 0;
                  if (-1 < (short)(uVar40 >> 0x10)) {
                    uVar44 = uVar45;
                  }
                  auVar3 = *(undefined1 (*) [16])
                            (lVar11 + (lVar50 + uVar45 + uVar44) * (long)p_Var12);
                  auVar4 = *(undefined1 (*) [16])(lVar11 + (lVar39 + uVar44) * (long)p_Var12);
                  auVar100._16_16_ =
                       *(undefined1 (*) [16])(lVar11 + (uVar44 + lVar48) * (long)p_Var12);
                  auVar100._0_16_ = auVar54;
                  auVar6 = vunpcklps_avx(auVar15,auVar55);
                  auVar5 = vunpckhps_avx(auVar15,auVar55);
                  auVar77 = vunpcklps_avx(auVar56,auVar54);
                  auVar56 = vunpckhps_avx(auVar56,auVar54);
                  auVar81 = vunpcklps_avx(auVar5,auVar56);
                  auVar78 = vunpcklps_avx(auVar6,auVar77);
                  auVar56 = vunpckhps_avx(auVar6,auVar77);
                  auVar6 = vunpcklps_avx(auVar84,auVar4);
                  auVar5 = vunpckhps_avx(auVar84,auVar4);
                  auVar77 = vunpcklps_avx(auVar54,auVar3);
                  auVar3 = vunpckhps_avx(auVar54,auVar3);
                  auVar5 = vunpcklps_avx(auVar5,auVar3);
                  auVar82 = vunpcklps_avx(auVar6,auVar77);
                  auVar3 = vunpckhps_avx(auVar6,auVar77);
                  auVar93._16_16_ = auVar4;
                  auVar93._0_16_ = auVar84;
                  auVar89._16_16_ = auVar55;
                  auVar89._0_16_ = auVar15;
                  auVar57 = vunpcklps_avx(auVar89,auVar93);
                  auVar85._16_16_ = auVar54;
                  auVar85._0_16_ = *(undefined1 (*) [16])(lVar11 + (long)p_Var12 * lVar50);
                  auVar58 = vunpcklps_avx(auVar85,auVar100);
                  auVar64 = vunpcklps_avx(auVar58,auVar57);
                  auVar65 = vunpckhps_avx(auVar58,auVar57);
                  auVar57 = vunpckhps_avx(auVar89,auVar93);
                  auVar58 = vunpckhps_avx(auVar85,auVar100);
                  auVar66 = vunpcklps_avx(auVar58,auVar57);
                  auVar57._16_16_ = auVar78;
                  auVar57._0_16_ = auVar78;
                  auVar91._16_16_ = auVar56;
                  auVar91._0_16_ = auVar56;
                  auVar94._16_16_ = auVar81;
                  auVar94._0_16_ = auVar81;
                  auVar95._16_16_ = auVar82;
                  auVar95._0_16_ = auVar82;
                  auVar101._16_16_ = auVar3;
                  auVar101._0_16_ = auVar3;
                  auVar98._16_16_ = auVar5;
                  auVar98._0_16_ = auVar5;
                  auVar57 = vsubps_avx(auVar64,auVar57);
                  auVar58 = vsubps_avx(auVar65,auVar91);
                  auVar59 = vsubps_avx(auVar66,auVar94);
                  auVar60 = vsubps_avx(auVar95,auVar64);
                  auVar71 = vsubps_avx(auVar101,auVar65);
                  auVar70 = vsubps_avx(auVar98,auVar66);
                  auVar29._4_4_ = auVar58._4_4_ * auVar70._4_4_;
                  auVar29._0_4_ = auVar58._0_4_ * auVar70._0_4_;
                  auVar29._8_4_ = auVar58._8_4_ * auVar70._8_4_;
                  auVar29._12_4_ = auVar58._12_4_ * auVar70._12_4_;
                  auVar29._16_4_ = auVar58._16_4_ * auVar70._16_4_;
                  auVar29._20_4_ = auVar58._20_4_ * auVar70._20_4_;
                  auVar29._24_4_ = auVar58._24_4_ * auVar70._24_4_;
                  auVar29._28_4_ = auVar78._12_4_;
                  auVar15 = vfmsub231ps_fma(auVar29,auVar71,auVar59);
                  auVar30._4_4_ = auVar59._4_4_ * auVar60._4_4_;
                  auVar30._0_4_ = auVar59._0_4_ * auVar60._0_4_;
                  auVar30._8_4_ = auVar59._8_4_ * auVar60._8_4_;
                  auVar30._12_4_ = auVar59._12_4_ * auVar60._12_4_;
                  auVar30._16_4_ = auVar59._16_4_ * auVar60._16_4_;
                  auVar30._20_4_ = auVar59._20_4_ * auVar60._20_4_;
                  auVar30._24_4_ = auVar59._24_4_ * auVar60._24_4_;
                  auVar30._28_4_ = auVar56._12_4_;
                  auVar84 = vfmsub231ps_fma(auVar30,auVar70,auVar57);
                  auVar31._4_4_ = auVar57._4_4_ * auVar71._4_4_;
                  auVar31._0_4_ = auVar57._0_4_ * auVar71._0_4_;
                  auVar31._8_4_ = auVar57._8_4_ * auVar71._8_4_;
                  auVar31._12_4_ = auVar57._12_4_ * auVar71._12_4_;
                  auVar31._16_4_ = auVar57._16_4_ * auVar71._16_4_;
                  auVar31._20_4_ = auVar57._20_4_ * auVar71._20_4_;
                  auVar31._24_4_ = auVar57._24_4_ * auVar71._24_4_;
                  auVar31._28_4_ = auVar81._12_4_;
                  auVar61 = vbroadcastss_avx512vl
                                      (ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[0]));
                  auVar62 = vbroadcastss_avx512vl
                                      (ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
                  auVar63 = vbroadcastss_avx512vl
                                      (ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]));
                  uVar76 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
                  auVar67._4_4_ = uVar76;
                  auVar67._0_4_ = uVar76;
                  auVar67._8_4_ = uVar76;
                  auVar67._12_4_ = uVar76;
                  auVar67._16_4_ = uVar76;
                  auVar67._20_4_ = uVar76;
                  auVar67._24_4_ = uVar76;
                  auVar67._28_4_ = uVar76;
                  auVar64 = vsubps_avx512vl(auVar64,auVar67);
                  auVar54 = vfmsub231ps_fma(auVar31,auVar60,auVar58);
                  uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
                  auVar68._4_4_ = uVar76;
                  auVar68._0_4_ = uVar76;
                  auVar68._8_4_ = uVar76;
                  auVar68._12_4_ = uVar76;
                  auVar68._16_4_ = uVar76;
                  auVar68._20_4_ = uVar76;
                  auVar68._24_4_ = uVar76;
                  auVar68._28_4_ = uVar76;
                  auVar65 = vsubps_avx512vl(auVar65,auVar68);
                  uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                  auVar69._4_4_ = uVar76;
                  auVar69._0_4_ = uVar76;
                  auVar69._8_4_ = uVar76;
                  auVar69._12_4_ = uVar76;
                  auVar69._16_4_ = uVar76;
                  auVar69._20_4_ = uVar76;
                  auVar69._24_4_ = uVar76;
                  auVar69._28_4_ = uVar76;
                  auVar66 = vsubps_avx512vl(auVar66,auVar69);
                  auVar67 = vmulps_avx512vl(auVar62,auVar66);
                  auVar67 = vfmsub231ps_avx512vl(auVar67,auVar65,auVar63);
                  auVar68 = vmulps_avx512vl(auVar63,auVar64);
                  auVar68 = vfmsub231ps_avx512vl(auVar68,auVar66,auVar61);
                  auVar69 = vmulps_avx512vl(auVar61,auVar65);
                  auVar69 = vfmsub231ps_avx512vl(auVar69,auVar64,auVar62);
                  auVar63 = vmulps_avx512vl(auVar63,ZEXT1632(auVar54));
                  auVar62 = vfmadd231ps_avx512vl(auVar63,ZEXT1632(auVar84),auVar62);
                  local_2500 = vfmadd231ps_avx512vl(auVar62,ZEXT1632(auVar15),auVar61);
                  auVar24._8_4_ = 0x7fffffff;
                  auVar24._0_8_ = 0x7fffffff7fffffff;
                  auVar24._12_4_ = 0x7fffffff;
                  auVar24._16_4_ = 0x7fffffff;
                  auVar24._20_4_ = 0x7fffffff;
                  auVar24._24_4_ = 0x7fffffff;
                  auVar24._28_4_ = 0x7fffffff;
                  vandps_avx512vl(local_2500,auVar24);
                  auVar70 = vmulps_avx512vl(auVar70,auVar69);
                  auVar71 = vfmadd231ps_avx512vl(auVar70,auVar68,auVar71);
                  auVar60 = vfmadd231ps_avx512vl(auVar71,auVar67,auVar60);
                  auVar25._8_4_ = 0x80000000;
                  auVar25._0_8_ = 0x8000000080000000;
                  auVar25._12_4_ = 0x80000000;
                  auVar25._16_4_ = 0x80000000;
                  auVar25._20_4_ = 0x80000000;
                  auVar25._24_4_ = 0x80000000;
                  auVar25._28_4_ = 0x80000000;
                  auVar71 = vandpd_avx512vl(local_2500,auVar25);
                  uVar53 = auVar71._0_4_;
                  auVar99._0_4_ = (float)(uVar53 ^ auVar60._0_4_);
                  uVar103 = auVar71._4_4_;
                  auVar99._4_4_ = (float)(uVar103 ^ auVar60._4_4_);
                  uVar104 = auVar71._8_4_;
                  auVar99._8_4_ = (float)(uVar104 ^ auVar60._8_4_);
                  uVar105 = auVar71._12_4_;
                  auVar99._12_4_ = (float)(uVar105 ^ auVar60._12_4_);
                  fVar75 = auVar71._16_4_;
                  auVar99._16_4_ = (float)((uint)fVar75 ^ auVar60._16_4_);
                  fVar106 = auVar71._20_4_;
                  auVar99._20_4_ = (float)((uint)fVar106 ^ auVar60._20_4_);
                  fVar107 = auVar71._24_4_;
                  auVar99._24_4_ = (float)((uint)fVar107 ^ auVar60._24_4_);
                  uVar108 = auVar71._28_4_;
                  auVar99._28_4_ = (float)(uVar108 ^ auVar60._28_4_);
                  auVar59 = vmulps_avx512vl(auVar59,auVar69);
                  auVar58 = vfmadd231ps_avx512vl(auVar59,auVar58,auVar68);
                  auVar57 = vfmadd231ps_avx512vl(auVar58,auVar57,auVar67);
                  auVar102._0_4_ = (float)(uVar53 ^ auVar57._0_4_);
                  auVar102._4_4_ = (float)(uVar103 ^ auVar57._4_4_);
                  auVar102._8_4_ = (float)(uVar104 ^ auVar57._8_4_);
                  auVar102._12_4_ = (float)(uVar105 ^ auVar57._12_4_);
                  auVar102._16_4_ = (float)((uint)fVar75 ^ auVar57._16_4_);
                  auVar102._20_4_ = (float)((uint)fVar106 ^ auVar57._20_4_);
                  auVar102._24_4_ = (float)((uint)fVar107 ^ auVar57._24_4_);
                  auVar102._28_4_ = (float)(uVar108 ^ auVar57._28_4_);
                  uVar22 = vcmpps_avx512vl(auVar99,ZEXT832(0) << 0x20,5);
                  uVar23 = vcmpps_avx512vl(auVar102,ZEXT832(0) << 0x20,5);
                  uVar20 = vcmpps_avx512vl(local_2500,ZEXT832(0) << 0x20,4);
                  auVar109._0_4_ = auVar99._0_4_ + auVar102._0_4_;
                  auVar109._4_4_ = auVar99._4_4_ + auVar102._4_4_;
                  auVar109._8_4_ = auVar99._8_4_ + auVar102._8_4_;
                  auVar109._12_4_ = auVar99._12_4_ + auVar102._12_4_;
                  auVar109._16_4_ = auVar99._16_4_ + auVar102._16_4_;
                  auVar109._20_4_ = auVar99._20_4_ + auVar102._20_4_;
                  auVar109._24_4_ = auVar99._24_4_ + auVar102._24_4_;
                  auVar109._28_4_ = auVar99._28_4_ + auVar102._28_4_;
                  uVar21 = vcmpps_avx512vl(auVar109,local_2500,2);
                  local_24df = (byte)uVar22 & (byte)uVar23 & (byte)uVar20 & (byte)uVar21;
                  if (local_24df != 0) {
                    auVar32._4_4_ = auVar66._4_4_ * auVar54._4_4_;
                    auVar32._0_4_ = auVar66._0_4_ * auVar54._0_4_;
                    auVar32._8_4_ = auVar66._8_4_ * auVar54._8_4_;
                    auVar32._12_4_ = auVar66._12_4_ * auVar54._12_4_;
                    auVar32._16_4_ = auVar66._16_4_ * 0.0;
                    auVar32._20_4_ = auVar66._20_4_ * 0.0;
                    auVar32._24_4_ = auVar66._24_4_ * 0.0;
                    auVar32._28_4_ = auVar66._28_4_;
                    auVar56 = vfmadd213ps_fma(auVar65,ZEXT1632(auVar84),auVar32);
                    auVar56 = vfmadd213ps_fma(auVar64,ZEXT1632(auVar15),ZEXT1632(auVar56));
                    local_2520._0_4_ = (float)(uVar53 ^ auVar56._0_4_);
                    local_2520._4_4_ = (float)(uVar103 ^ auVar56._4_4_);
                    local_2520._8_4_ = (float)(uVar104 ^ auVar56._8_4_);
                    local_2520._12_4_ = (float)(uVar105 ^ auVar56._12_4_);
                    local_2520._16_4_ = fVar75;
                    local_2520._20_4_ = fVar106;
                    local_2520._24_4_ = fVar107;
                    local_2520._28_4_ = uVar108;
                    uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
                    auVar26._4_4_ = uVar76;
                    auVar26._0_4_ = uVar76;
                    auVar26._8_4_ = uVar76;
                    auVar26._12_4_ = uVar76;
                    auVar26._16_4_ = uVar76;
                    auVar26._20_4_ = uVar76;
                    auVar26._24_4_ = uVar76;
                    auVar26._28_4_ = uVar76;
                    auVar57 = vmulps_avx512vl(local_2500,auVar26);
                    fVar86 = local_2500._0_4_;
                    fVar87 = local_2500._4_4_;
                    auVar33._4_4_ = fVar74 * fVar87;
                    auVar33._0_4_ = fVar74 * fVar86;
                    fVar88 = local_2500._8_4_;
                    auVar33._8_4_ = fVar74 * fVar88;
                    fVar16 = local_2500._12_4_;
                    auVar33._12_4_ = fVar74 * fVar16;
                    fVar17 = local_2500._16_4_;
                    auVar33._16_4_ = fVar74 * fVar17;
                    fVar18 = local_2500._20_4_;
                    auVar33._20_4_ = fVar74 * fVar18;
                    fVar19 = local_2500._24_4_;
                    auVar33._24_4_ = fVar74 * fVar19;
                    auVar33._28_4_ = fVar74;
                    uVar22 = vcmpps_avx512vl(local_2520,auVar33,2);
                    uVar23 = vcmpps_avx512vl(auVar57,local_2520,1);
                    local_24df = (byte)uVar22 & (byte)uVar23 & local_24df;
                    if (local_24df != 0) {
                      auVar57 = vsubps_avx(local_2500,auVar102);
                      auVar57 = vblendps_avx(auVar99,auVar57,0xf0);
                      auVar58 = vsubps_avx(local_2500,auVar99);
                      auVar58 = vblendps_avx(auVar102,auVar58,0xf0);
                      local_2460._0_4_ = auVar15._0_4_ * 1.0;
                      local_2460._4_4_ = auVar15._4_4_ * 1.0;
                      local_2460._8_4_ = auVar15._8_4_ * 1.0;
                      local_2460._12_4_ = auVar15._12_4_ * 1.0;
                      local_2460._16_4_ = 0x80000000;
                      local_2460._20_4_ = 0x80000000;
                      local_2460._24_4_ = 0x80000000;
                      local_2460._28_4_ = 0;
                      local_2440._4_4_ = auVar84._4_4_ * 1.0;
                      local_2440._0_4_ = auVar84._0_4_ * 1.0;
                      local_2440._8_4_ = auVar84._8_4_ * 1.0;
                      local_2440._12_4_ = auVar84._12_4_ * 1.0;
                      local_2440._16_4_ = 0x80000000;
                      local_2440._20_4_ = 0x80000000;
                      local_2440._24_4_ = 0x80000000;
                      local_2440._28_4_ = 0;
                      local_2420._4_4_ = auVar54._4_4_ * 1.0;
                      local_2420._0_4_ = auVar54._0_4_ * 1.0;
                      local_2420._8_4_ = auVar54._8_4_ * 1.0;
                      local_2420._12_4_ = auVar54._12_4_ * 1.0;
                      local_2420._16_4_ = 0x80000000;
                      local_2420._20_4_ = 0x80000000;
                      local_2420._24_4_ = 0x80000000;
                      local_2420._28_4_ = 0;
                      uVar76 = auVar92._0_4_;
                      auVar90._4_4_ = uVar76;
                      auVar90._0_4_ = uVar76;
                      auVar90._8_4_ = uVar76;
                      auVar90._12_4_ = uVar76;
                      auVar90._16_4_ = uVar76;
                      auVar90._20_4_ = uVar76;
                      auVar90._24_4_ = uVar76;
                      auVar90._28_4_ = uVar76;
                      auVar59 = vpaddd_avx2(auVar90,_DAT_0205d4c0);
                      auVar60 = vpermps_avx512vl(auVar113._0_32_,ZEXT1632(auVar92));
                      auVar15 = vcvtsi2ss_avx512f(auVar110._0_16_,
                                                  *(ushort *)(lVar10 + 8 + lVar42) - 1);
                      auVar60 = vpaddd_avx2(auVar60,_DAT_0205d4e0);
                      auVar34._12_4_ = 0;
                      auVar34._0_12_ = ZEXT812(0);
                      auVar84 = vrcp14ss_avx512f(auVar34 << 0x20,ZEXT416(auVar15._0_4_));
                      auVar15 = vfnmadd213ss_fma(auVar15,auVar84,SUB6416(ZEXT464(0x40000000),0));
                      fStack_2544 = auVar84._0_4_ * auVar15._0_4_;
                      auVar15 = vcvtsi2ss_avx512f(auVar110._0_16_,
                                                  *(ushort *)(lVar10 + 10 + lVar42) - 1);
                      auVar84 = vrcp14ss_avx512f(auVar34 << 0x20,ZEXT416(auVar15._0_4_));
                      auVar15 = vfnmadd213ss_fma(auVar15,auVar84,SUB6416(ZEXT464(0x40000000),0));
                      fStack_2528 = auVar84._0_4_ * auVar15._0_4_;
                      auVar59 = vcvtdq2ps_avx(auVar59);
                      local_2560 = (fVar86 * auVar59._0_4_ + auVar57._0_4_) * fStack_2544;
                      fStack_255c = (fVar87 * auVar59._4_4_ + auVar57._4_4_) * fStack_2544;
                      fStack_2558 = (fVar88 * auVar59._8_4_ + auVar57._8_4_) * fStack_2544;
                      fStack_2554 = (fVar16 * auVar59._12_4_ + auVar57._12_4_) * fStack_2544;
                      fStack_2550 = (fVar17 * auVar59._16_4_ + auVar57._16_4_) * fStack_2544;
                      fStack_254c = (fVar18 * auVar59._20_4_ + auVar57._20_4_) * fStack_2544;
                      fStack_2548 = (fVar19 * auVar59._24_4_ + auVar57._24_4_) * fStack_2544;
                      auVar57 = vcvtdq2ps_avx(auVar60);
                      local_2540 = (fVar86 * auVar57._0_4_ + auVar58._0_4_) * fStack_2528;
                      fStack_253c = (fVar87 * auVar57._4_4_ + auVar58._4_4_) * fStack_2528;
                      fStack_2538 = (fVar88 * auVar57._8_4_ + auVar58._8_4_) * fStack_2528;
                      fStack_2534 = (fVar16 * auVar57._12_4_ + auVar58._12_4_) * fStack_2528;
                      fStack_2530 = (fVar17 * auVar57._16_4_ + auVar58._16_4_) * fStack_2528;
                      fStack_252c = (fVar18 * auVar57._20_4_ + auVar58._20_4_) * fStack_2528;
                      fStack_2528 = (fVar19 * auVar57._24_4_ + auVar58._24_4_) * fStack_2528;
                      fStack_2524 = auVar57._28_4_ + auVar58._28_4_;
                      if ((pGVar9->mask & (ray->super_RayK<1>).mask) != 0) {
                        puVar51 = (ulong *)(ulong)local_24df;
                        auVar57 = vrcp14ps_avx512vl(local_2500);
                        auVar27._8_4_ = 0x3f800000;
                        auVar27._0_8_ = &DAT_3f8000003f800000;
                        auVar27._12_4_ = 0x3f800000;
                        auVar27._16_4_ = 0x3f800000;
                        auVar27._20_4_ = 0x3f800000;
                        auVar27._24_4_ = 0x3f800000;
                        auVar27._28_4_ = 0x3f800000;
                        auVar58 = vfnmadd213ps_avx512vl(local_2500,auVar57,auVar27);
                        auVar15 = vfmadd132ps_fma(auVar58,auVar57,auVar57);
                        fVar74 = auVar15._0_4_;
                        fVar86 = auVar15._4_4_;
                        local_2480._4_4_ = fVar86 * local_2520._4_4_;
                        local_2480._0_4_ = fVar74 * local_2520._0_4_;
                        fVar87 = auVar15._8_4_;
                        local_2480._8_4_ = fVar87 * local_2520._8_4_;
                        fVar88 = auVar15._12_4_;
                        local_2480._12_4_ = fVar88 * local_2520._12_4_;
                        local_2480._16_4_ = fVar75 * 0.0;
                        local_2480._20_4_ = fVar106 * 0.0;
                        local_2480._24_4_ = fVar107 * 0.0;
                        local_2480._28_4_ = auVar57._28_4_;
                        local_24c0[0] = local_2560 * fVar74;
                        local_24c0[1] = fStack_255c * fVar86;
                        local_24c0[2] = fStack_2558 * fVar87;
                        local_24c0[3] = fStack_2554 * fVar88;
                        fStack_24b0 = fStack_2550 * 0.0;
                        fStack_24ac = fStack_254c * 0.0;
                        fStack_24a8 = fStack_2548 * 0.0;
                        fStack_24a4 = fStack_2544;
                        local_24a0[0] = local_2540 * fVar74;
                        local_24a0[1] = fStack_253c * fVar86;
                        local_24a0[2] = fStack_2538 * fVar87;
                        local_24a0[3] = fStack_2534 * fVar88;
                        fStack_2490 = fStack_2530 * 0.0;
                        fStack_248c = fStack_252c * 0.0;
                        fStack_2488 = fStack_2528 * 0.0;
                        fStack_2484 = fStack_2544;
                        auVar79._8_4_ = 0x7f800000;
                        auVar79._0_8_ = 0x7f8000007f800000;
                        auVar79._12_4_ = 0x7f800000;
                        auVar79._16_4_ = 0x7f800000;
                        auVar79._20_4_ = 0x7f800000;
                        auVar79._24_4_ = 0x7f800000;
                        auVar79._28_4_ = 0x7f800000;
                        auVar57 = vblendmps_avx512vl(auVar79,local_2480);
                        auVar72._0_4_ =
                             (uint)(local_24df & 1) * auVar57._0_4_ |
                             (uint)!(bool)(local_24df & 1) * 0x7f800000;
                        bVar14 = (bool)(local_24df >> 1 & 1);
                        auVar72._4_4_ = (uint)bVar14 * auVar57._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(local_24df >> 2 & 1);
                        auVar72._8_4_ = (uint)bVar14 * auVar57._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(local_24df >> 3 & 1);
                        auVar72._12_4_ = (uint)bVar14 * auVar57._12_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(local_24df >> 4 & 1);
                        auVar72._16_4_ = (uint)bVar14 * auVar57._16_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(local_24df >> 5 & 1);
                        auVar72._20_4_ = (uint)bVar14 * auVar57._20_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(local_24df >> 6 & 1);
                        auVar72._24_4_ = (uint)bVar14 * auVar57._24_4_ | (uint)!bVar14 * 0x7f800000;
                        auVar72._28_4_ =
                             (uint)(local_24df >> 7) * auVar57._28_4_ |
                             (uint)!(bool)(local_24df >> 7) * 0x7f800000;
                        auVar57 = vshufps_avx(auVar72,auVar72,0xb1);
                        auVar57 = vminps_avx(auVar72,auVar57);
                        auVar58 = vshufpd_avx(auVar57,auVar57,5);
                        auVar57 = vminps_avx(auVar57,auVar58);
                        auVar58 = vpermpd_avx2(auVar57,0x4e);
                        auVar57 = vminps_avx(auVar57,auVar58);
                        uVar22 = vcmpps_avx512vl(auVar72,auVar57,0);
                        bVar35 = (byte)uVar22 & local_24df;
                        if (bVar35 == 0) {
                          bVar35 = local_24df;
                        }
                        local_2760 = 0;
                        for (uVar40 = (ulong)bVar35; (uVar40 & 1) == 0;
                            uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                          local_2760 = local_2760 + 1;
                        }
                        pRVar43 = context->args;
                        if ((pRVar43->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar74 = local_24c0[local_2760];
                          fVar75 = local_24a0[local_2760];
                          fVar86 = *(float *)(local_2460 + local_2760 * 4);
                          fVar106 = *(float *)(local_2440 + local_2760 * 4);
                          fVar107 = *(float *)(local_2420 + local_2760 * 4);
                          (ray->super_RayK<1>).tfar = *(float *)(local_2480 + local_2760 * 4);
                          (ray->Ng).field_0.field_0.x = fVar86;
                          (ray->Ng).field_0.field_0.y = fVar106;
                          (ray->Ng).field_0.field_0.z = fVar107;
                          ray->u = fVar74;
                          ray->v = fVar75;
                          ray->primID = uVar8;
                          ray->geomID = uVar7;
                          pRVar13 = context->user;
                          ray->instID[0] = pRVar13->instID[0];
                          ray->instPrimID[0] = pRVar13->instPrimID[0];
                        }
                        else {
                          local_2400 = local_2480;
                          local_2758 = context->user;
                          local_2768 = pRVar43;
                          local_2580 = auVar110._0_32_;
                          local_25a0 = auVar111._0_32_;
                          local_25c0 = auVar112._0_32_;
                          local_25e0 = auVar114._0_32_;
                          local_2600 = auVar115._0_32_;
                          local_2620 = auVar116._0_32_;
                          local_2640 = auVar117._0_32_;
                          local_2660 = auVar118._0_32_;
                          do {
                            local_2684 = local_24c0[local_2760];
                            local_2680 = local_24a0[local_2760];
                            fVar74 = (ray->super_RayK<1>).tfar;
                            (ray->super_RayK<1>).tfar = *(float *)(local_2480 + local_2760 * 4);
                            local_2690 = *(float *)(local_2460 + local_2760 * 4);
                            local_268c = *(undefined4 *)(local_2440 + local_2760 * 4);
                            local_2688 = *(undefined4 *)(local_2420 + local_2760 * 4);
                            local_267c = uVar8;
                            local_2678 = uVar7;
                            local_2674 = local_2758->instID[0];
                            local_2670 = local_2758->instPrimID[0];
                            local_276c = -1;
                            local_26c0.valid = &local_276c;
                            local_26c0.geometryUserPtr = pGVar9->userPtr;
                            local_26c0.context = local_2758;
                            local_26c0.ray = (RTCRayN *)ray;
                            local_26c0.hit = (RTCHitN *)&local_2690;
                            local_26c0.N = 1;
                            if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01fd972f:
                              if (pRVar43->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar43->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar43->filter)(&local_26c0);
                                }
                                auVar110 = ZEXT3264(local_2580);
                                auVar111 = ZEXT3264(local_25a0);
                                auVar112 = ZEXT3264(local_25c0);
                                auVar57 = vbroadcastss_avx512vl(ZEXT416(1));
                                auVar113 = ZEXT3264(auVar57);
                                auVar114 = ZEXT3264(local_25e0);
                                auVar115 = ZEXT3264(local_2600);
                                auVar116 = ZEXT3264(local_2620);
                                auVar117 = ZEXT3264(local_2640);
                                auVar118 = ZEXT3264(local_2660);
                                auVar57 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                                auVar119 = ZEXT3264(auVar57);
                                pRVar43 = local_2768;
                                if (*local_26c0.valid == 0) goto LAB_01fd981a;
                              }
                              (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.x =
                                   *(float *)local_26c0.hit;
                              (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_26c0.hit + 4);
                              (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_26c0.hit + 8);
                              *(float *)((long)local_26c0.ray + 0x3c) =
                                   *(float *)(local_26c0.hit + 0xc);
                              *(float *)((long)local_26c0.ray + 0x40) =
                                   *(float *)(local_26c0.hit + 0x10);
                              *(float *)((long)local_26c0.ray + 0x44) =
                                   *(float *)(local_26c0.hit + 0x14);
                              *(float *)((long)local_26c0.ray + 0x48) =
                                   *(float *)(local_26c0.hit + 0x18);
                              *(float *)((long)local_26c0.ray + 0x4c) =
                                   *(float *)(local_26c0.hit + 0x1c);
                              *(float *)((long)local_26c0.ray + 0x50) =
                                   *(float *)(local_26c0.hit + 0x20);
                            }
                            else {
                              (*pGVar9->intersectionFilterN)(&local_26c0);
                              auVar57 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                              auVar119 = ZEXT3264(auVar57);
                              auVar118 = ZEXT3264(local_2660);
                              auVar117 = ZEXT3264(local_2640);
                              auVar116 = ZEXT3264(local_2620);
                              auVar115 = ZEXT3264(local_2600);
                              auVar114 = ZEXT3264(local_25e0);
                              auVar57 = vbroadcastss_avx512vl(ZEXT416(1));
                              auVar113 = ZEXT3264(auVar57);
                              auVar112 = ZEXT3264(local_25c0);
                              auVar111 = ZEXT3264(local_25a0);
                              auVar110 = ZEXT3264(local_2580);
                              pRVar43 = local_2768;
                              if (*local_26c0.valid != 0) goto LAB_01fd972f;
LAB_01fd981a:
                              (ray->super_RayK<1>).tfar = fVar74;
                              pRVar43 = local_2768;
                            }
                            bVar36 = ~(byte)(1 << ((uint)local_2760 & 0x1f)) & (byte)puVar51;
                            fVar74 = (ray->super_RayK<1>).tfar;
                            auVar28._4_4_ = fVar74;
                            auVar28._0_4_ = fVar74;
                            auVar28._8_4_ = fVar74;
                            auVar28._12_4_ = fVar74;
                            auVar28._16_4_ = fVar74;
                            auVar28._20_4_ = fVar74;
                            auVar28._24_4_ = fVar74;
                            auVar28._28_4_ = fVar74;
                            uVar22 = vcmpps_avx512vl(local_2400,auVar28,2);
                            bVar35 = bVar36 & (byte)uVar22;
                            uVar53 = (uint)bVar35;
                            puVar51 = (ulong *)(ulong)uVar53;
                            if ((bVar36 & (byte)uVar22) != 0) {
                              auVar80._8_4_ = 0x7f800000;
                              auVar80._0_8_ = 0x7f8000007f800000;
                              auVar80._12_4_ = 0x7f800000;
                              auVar80._16_4_ = 0x7f800000;
                              auVar80._20_4_ = 0x7f800000;
                              auVar80._24_4_ = 0x7f800000;
                              auVar80._28_4_ = 0x7f800000;
                              auVar57 = vblendmps_avx512vl(auVar80,local_2400);
                              auVar73._0_4_ =
                                   (uint)(bVar35 & 1) * auVar57._0_4_ |
                                   (uint)!(bool)(bVar35 & 1) * 0x7f800000;
                              bVar14 = (bool)(bVar35 >> 1 & 1);
                              auVar73._4_4_ =
                                   (uint)bVar14 * auVar57._4_4_ | (uint)!bVar14 * 0x7f800000;
                              bVar14 = (bool)(bVar35 >> 2 & 1);
                              auVar73._8_4_ =
                                   (uint)bVar14 * auVar57._8_4_ | (uint)!bVar14 * 0x7f800000;
                              bVar14 = (bool)(bVar35 >> 3 & 1);
                              auVar73._12_4_ =
                                   (uint)bVar14 * auVar57._12_4_ | (uint)!bVar14 * 0x7f800000;
                              bVar14 = (bool)(bVar35 >> 4 & 1);
                              auVar73._16_4_ =
                                   (uint)bVar14 * auVar57._16_4_ | (uint)!bVar14 * 0x7f800000;
                              bVar14 = (bool)(bVar35 >> 5 & 1);
                              auVar73._20_4_ =
                                   (uint)bVar14 * auVar57._20_4_ | (uint)!bVar14 * 0x7f800000;
                              bVar14 = (bool)(bVar35 >> 6 & 1);
                              auVar73._24_4_ =
                                   (uint)bVar14 * auVar57._24_4_ | (uint)!bVar14 * 0x7f800000;
                              auVar73._28_4_ =
                                   (uint)(bVar35 >> 7) * auVar57._28_4_ |
                                   (uint)!(bool)(bVar35 >> 7) * 0x7f800000;
                              auVar57 = vshufps_avx(auVar73,auVar73,0xb1);
                              auVar57 = vminps_avx(auVar73,auVar57);
                              auVar58 = vshufpd_avx(auVar57,auVar57,5);
                              auVar57 = vminps_avx(auVar57,auVar58);
                              auVar58 = vpermpd_avx2(auVar57,0x4e);
                              auVar57 = vminps_avx(auVar57,auVar58);
                              uVar22 = vcmpps_avx512vl(auVar73,auVar57,0);
                              bVar36 = (byte)uVar22 & bVar35;
                              if (bVar36 != 0) {
                                uVar53 = (uint)bVar36;
                              }
                              uVar103 = 0;
                              for (; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x80000000) {
                                uVar103 = uVar103 + 1;
                              }
                              local_2760 = (ulong)uVar103;
                            }
                          } while (bVar35 != 0);
                        }
                      }
                    }
                  }
                }
                uVar49 = uVar49 - 1 & uVar49;
              } while (uVar49 != 0);
            }
            local_26d0 = local_26d0 + 1;
          } while (local_26d0 != local_26d8);
        }
        auVar57 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).tfar));
        auVar115 = ZEXT3264(auVar57);
        auVar97 = ZEXT3264(CONCAT428(0xfffffff8,
                                     CONCAT424(0xfffffff8,
                                               CONCAT420(0xfffffff8,
                                                         CONCAT416(0xfffffff8,
                                                                   CONCAT412(0xfffffff8,
                                                                             CONCAT48(0xfffffff8,
                                                                                                                                                                            
                                                  0xfffffff8fffffff8)))))));
        auVar96 = ZEXT3264(local_23e0);
        uVar49 = local_2750;
        uVar40 = local_2728;
        uVar44 = local_2730;
        uVar45 = local_2738;
        uVar46 = local_2740;
        uVar47 = local_2748;
        unaff_R12 = local_2720;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }